

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_sa_system.hpp
# Opt level: O2

void __thiscall
openjij::system::
SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
::SetRandomConfiguration
          (SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
           *this,SeedType seed)

{
  result_type_conflict1 rVar1;
  int32_t i;
  long lVar2;
  uniform_int_distribution<short> dist;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  random_number_engine;
  param_type local_13b4;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->sample_,(long)this->system_size_);
  local_13b4._M_a = 0;
  local_13b4._M_b = 1;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,seed);
  for (lVar2 = 0; lVar2 < this->system_size_; lVar2 = lVar2 + 1) {
    rVar1 = std::uniform_int_distribution<short>::operator()
                      ((uniform_int_distribution<short> *)&local_13b4,&local_13b0);
    (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] = (char)rVar1;
  }
  return;
}

Assistant:

void SetRandomConfiguration(const SeedType seed) {
      sample_.resize(system_size_);
      std::uniform_int_distribution<short> dist(0, 1);
      RandType random_number_engine(seed);
      for (std::int32_t i = 0; i < system_size_; i++) {
         sample_[i] = dist(random_number_engine);
      }
   }